

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::anon_unknown_0::ToFileName
                   (string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 local_30;
  int i;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_30 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_30 < uVar1;
      local_30 = local_30 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if ((*pcVar2 < 'A') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), 'Z' < *pcVar2)) {
      std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ToFileName(const string& input) {
  string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if ('A' <= input[i] && input[i] <= 'Z') {
      result.push_back(input[i] - 'A' + 'a');
    } else {
      result.push_back(input[i]);
    }
  }

  return result;
}